

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O1

void __thiscall glslang::TIntermediate::setEntryPointName(TIntermediate *this,char *ep)

{
  char *pcVar1;
  
  pcVar1 = (char *)(this->entryPointName)._M_string_length;
  strlen(ep);
  std::__cxx11::string::_M_replace((ulong)&this->entryPointName,0,pcVar1,(ulong)ep);
  TProcesses::addProcess(&this->processes,"entry-point");
  std::__cxx11::string::append
            ((char *)((this->processes).processes.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1));
  std::__cxx11::string::_M_append
            ((char *)((this->processes).processes.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1),
             (ulong)(this->entryPointName)._M_dataplus._M_p);
  return;
}

Assistant:

void setEntryPointName(const char* ep)
    {
        entryPointName = ep;
        processes.addProcess("entry-point");
        processes.addArgument(entryPointName);
    }